

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O3

void ncnn::pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  undefined8 *puVar1;
  void **ppvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  int *piVar15;
  size_t sVar16;
  Allocator *pAVar17;
  Mat *pMVar18;
  long lVar19;
  long lVar20;
  undefined1 (*pauVar21) [32];
  undefined1 (*pauVar22) [64];
  void *pvVar23;
  long lVar24;
  Mat *pMVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  undefined8 *puVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 (*pauVar36) [16];
  int iVar37;
  long lVar38;
  size_t *psVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  long lVar52;
  uint uVar53;
  uint uVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  long local_1c0;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_168;
  long local_158;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  
  iVar37 = A->elempack;
  psVar39 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar39 = &A->cstep;
  }
  uVar30 = 0;
  lVar43 = (long)k;
  lVar55 = (long)i;
  lVar44 = (long)(int)*psVar39;
  if (0xf < max_ii) {
    lVar19 = lVar44 * lVar55;
    lVar28 = (long)(k * 8) * 4;
    lVar57 = lVar28 + lVar19 * 4;
    lVar40 = (lVar55 + 8) * lVar44;
    lVar28 = lVar28 + lVar40 * 4;
    local_140 = (long)(k * 4) * 4;
    lVar46 = local_140 + lVar19 * 4;
    lVar29 = (lVar55 + 4) * lVar44;
    lVar49 = local_140 + lVar29 * 4;
    lVar34 = local_140 + lVar40 * 4;
    lVar47 = (lVar55 + 0xc) * lVar44;
    local_140 = local_140 + lVar47 * 4;
    lVar42 = lVar43 * 4;
    lVar19 = lVar42 + lVar19 * 4;
    lVar20 = lVar44 * 0x40;
    lVar52 = lVar44 * 4;
    local_168 = 0;
    uVar26 = 0;
    do {
      if (iVar37 == 0x10) {
        if (0 < max_kk) {
          pauVar22 = (undefined1 (*) [64])
                     ((long)A->data + (long)(k << 4) * 4 + (uVar26 + lVar55) * lVar44 * 4);
          iVar27 = max_kk;
          do {
            *(undefined1 (*) [64])AT = *pauVar22;
            AT = (Mat *)&AT->cstep;
            pauVar22 = pauVar22 + 1;
            iVar27 = iVar27 + -1;
          } while (iVar27 != 0);
          goto LAB_0049e6bf;
        }
      }
      else {
LAB_0049e6bf:
        if (iVar37 == 8) {
          if (max_kk < 1) goto LAB_0049ef5d;
          pvVar23 = A->data;
          iVar27 = max_kk;
          do {
            puVar32 = (undefined8 *)((long)pvVar23 + lVar57);
            piVar15 = (int *)puVar32[1];
            sVar16 = puVar32[2];
            uVar14 = puVar32[3];
            AT->data = (void *)*puVar32;
            AT->refcount = piVar15;
            AT->elemsize = sVar16;
            *(undefined8 *)&AT->elempack = uVar14;
            *(undefined1 (*) [32])&AT->allocator = *(undefined1 (*) [32])((long)pvVar23 + lVar28);
            AT = (Mat *)&AT->cstep;
            pvVar23 = (void *)((long)pvVar23 + 0x20);
            iVar27 = iVar27 + -1;
          } while (iVar27 != 0);
        }
        if (iVar37 == 4) {
          if (max_kk < 1) goto LAB_0049ef5d;
          pvVar23 = A->data;
          lVar56 = 0;
          pMVar18 = AT;
          iVar27 = max_kk;
          do {
            pMVar25 = pMVar18;
            puVar32 = (undefined8 *)((long)pvVar23 + lVar56 + lVar46);
            uVar14 = puVar32[1];
            puVar1 = (undefined8 *)((long)&AT->data + lVar56 * 4);
            *puVar1 = *puVar32;
            puVar1[1] = uVar14;
            puVar32 = (undefined8 *)((long)pvVar23 + lVar56 + lVar49);
            uVar14 = puVar32[1];
            puVar1[2] = *puVar32;
            puVar1[3] = uVar14;
            puVar32 = (undefined8 *)((long)pvVar23 + lVar56 + lVar34);
            uVar14 = puVar32[1];
            puVar1[4] = *puVar32;
            puVar1[5] = uVar14;
            *(undefined1 (*) [16])(puVar1 + 6) =
                 *(undefined1 (*) [16])((long)pvVar23 + lVar56 + local_140);
            lVar56 = lVar56 + 0x10;
            iVar27 = iVar27 + -1;
            pMVar18 = (Mat *)(puVar1 + 8);
          } while (iVar27 != 0);
          AT = (Mat *)&pMVar25->cstep;
        }
        if (iVar37 == 1) {
          pvVar23 = A->data;
          if (max_kk < 0x10) {
            local_e8 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55) * lVar44 * 4;
            local_f8 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 1) * lVar44 * 4;
            local_128 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 2) * lVar44 * 4;
            local_f0 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 3) * lVar44 * 4;
            lVar51 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 4) * lVar44 * 4;
            local_120 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 5) * lVar44 * 4;
            lVar45 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 6) * lVar44 * 4;
            local_100 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 7) * lVar44 * 4;
            lVar38 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 8) * lVar44 * 4;
            local_138 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 9) * lVar44 * 4;
            local_130 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 10) * lVar44 * 4;
            lVar48 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 0xb) * lVar44 * 4;
            lVar33 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 0xc) * lVar44 * 4;
            lVar24 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 0xd) * lVar44 * 4;
            lVar35 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 0xe) * lVar44 * 4;
            lVar56 = (long)pvVar23 + lVar43 * 4 + (uVar26 + lVar55 + 0xf) * lVar44 * 4;
            uVar53 = 0;
          }
          else {
            local_e8 = (long)pvVar23 + local_168;
            iVar27 = 0xf;
            do {
              lVar56 = local_e8 + lVar19;
              lVar35 = lVar56 + lVar44 * 8;
              auVar59 = *(undefined1 (*) [64])(lVar56 + lVar44 * 4);
              auVar61 = *(undefined1 (*) [64])(lVar56 + lVar44 * 8);
              auVar62 = *(undefined1 (*) [64])(lVar35 + lVar44 * 4);
              lVar24 = lVar44 * 8 + lVar35;
              auVar63 = *(undefined1 (*) [64])(lVar35 + lVar44 * 8);
              lVar56 = lVar24 + lVar44 * 4;
              auVar64 = *(undefined1 (*) [64])(lVar24 + lVar44 * 4);
              auVar65 = *(undefined1 (*) [64])(lVar52 + lVar56);
              lVar56 = lVar56 + lVar52;
              auVar66 = *(undefined1 (*) [64])(lVar52 + lVar56);
              lVar56 = lVar56 + lVar52;
              auVar67 = *(undefined1 (*) [64])(lVar52 + lVar56);
              lVar56 = lVar56 + lVar52;
              auVar68 = *(undefined1 (*) [64])(lVar52 + lVar56);
              lVar56 = lVar56 + lVar52;
              auVar69 = *(undefined1 (*) [64])(lVar52 + lVar56);
              lVar56 = lVar56 + lVar52;
              auVar70 = *(undefined1 (*) [64])(lVar52 + lVar56);
              lVar56 = lVar56 + lVar52;
              auVar71 = *(undefined1 (*) [64])(lVar52 + lVar56);
              lVar56 = lVar56 + lVar52;
              auVar72 = *(undefined1 (*) [64])(lVar52 + lVar56);
              lVar56 = lVar56 + lVar52;
              auVar73 = *(undefined1 (*) [64])(lVar52 + lVar56);
              auVar74 = *(undefined1 (*) [64])(lVar56 + lVar44 * 8);
              auVar58 = vunpcklps_avx512f(*(undefined1 (*) [64])(local_e8 + lVar19),auVar59);
              auVar59 = vunpckhps_avx512f(*(undefined1 (*) [64])(local_e8 + lVar19),auVar59);
              auVar60 = vunpcklps_avx512f(auVar61,auVar62);
              auVar61 = vunpckhps_avx512f(auVar61,auVar62);
              auVar62 = vunpcklps_avx512f(auVar63,auVar64);
              auVar63 = vunpckhps_avx512f(auVar63,auVar64);
              auVar64 = vunpcklps_avx512f(auVar65,auVar66);
              auVar65 = vunpckhps_avx512f(auVar65,auVar66);
              auVar66 = vunpcklps_avx512f(auVar67,auVar68);
              auVar67 = vunpckhps_avx512f(auVar67,auVar68);
              auVar68 = vunpcklps_avx512f(auVar69,auVar70);
              auVar69 = vunpckhps_avx512f(auVar69,auVar70);
              auVar70 = vunpcklps_avx512f(auVar71,auVar72);
              auVar71 = vunpckhps_avx512f(auVar71,auVar72);
              auVar72 = vunpcklps_avx512f(auVar73,auVar74);
              auVar73 = vunpckhps_avx512f(auVar73,auVar74);
              auVar74 = vunpcklpd_avx512f(auVar58,auVar60);
              auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
              auVar60 = vunpcklpd_avx512f(auVar59,auVar61);
              auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
              auVar61 = vunpcklpd_avx512f(auVar62,auVar64);
              auVar62 = vunpckhpd_avx512f(auVar62,auVar64);
              auVar64 = vunpcklpd_avx512f(auVar63,auVar65);
              auVar63 = vunpckhpd_avx512f(auVar63,auVar65);
              auVar65 = vunpcklpd_avx512f(auVar66,auVar68);
              auVar66 = vunpckhpd_avx512f(auVar66,auVar68);
              auVar68 = vunpcklpd_avx512f(auVar67,auVar69);
              auVar67 = vunpckhpd_avx512f(auVar67,auVar69);
              auVar69 = vunpcklpd_avx512f(auVar70,auVar72);
              auVar70 = vunpckhpd_avx512f(auVar70,auVar72);
              auVar72 = vunpcklpd_avx512f(auVar71,auVar73);
              auVar71 = vunpckhpd_avx512f(auVar71,auVar73);
              auVar73 = vshuff64x2_avx512f(auVar74,auVar61,0x88);
              auVar75 = vshuff64x2_avx512f(auVar65,auVar69,0x88);
              auVar76 = vshuff64x2_avx512f(auVar58,auVar62,0x88);
              auVar77 = vshuff64x2_avx512f(auVar66,auVar70,0x88);
              auVar78 = vshuff64x2_avx512f(auVar60,auVar64,0x88);
              auVar79 = vshuff64x2_avx512f(auVar68,auVar72,0x88);
              auVar80 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
              auVar81 = vshuff64x2_avx512f(auVar67,auVar71,0x88);
              auVar61 = vshuff64x2_avx512f(auVar74,auVar61,0xdd);
              auVar65 = vshuff64x2_avx512f(auVar65,auVar69,0xdd);
              auVar62 = vshuff64x2_avx512f(auVar58,auVar62,0xdd);
              auVar66 = vshuff64x2_avx512f(auVar66,auVar70,0xdd);
              auVar64 = vshuff64x2_avx512f(auVar60,auVar64,0xdd);
              auVar68 = vshuff64x2_avx512f(auVar68,auVar72,0xdd);
              auVar59 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
              auVar63 = vshuff64x2_avx512f(auVar67,auVar71,0xdd);
              auVar67 = vshuff64x2_avx512f(auVar73,auVar75,0x88);
              auVar69 = vshuff64x2_avx512f(auVar76,auVar77,0x88);
              auVar70 = vshuff64x2_avx512f(auVar78,auVar79,0x88);
              auVar71 = vshuff64x2_avx512f(auVar80,auVar81,0x88);
              auVar72 = vshuff64x2_avx512f(auVar61,auVar65,0x88);
              auVar74 = vshuff64x2_avx512f(auVar62,auVar66,0x88);
              auVar58 = vshuff64x2_avx512f(auVar64,auVar68,0x88);
              auVar60 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
              auVar73 = vshuff64x2_avx512f(auVar73,auVar75,0xdd);
              auVar75 = vshuff64x2_avx512f(auVar76,auVar77,0xdd);
              auVar76 = vshuff64x2_avx512f(auVar78,auVar79,0xdd);
              auVar77 = vshuff64x2_avx512f(auVar80,auVar81,0xdd);
              auVar61 = vshuff64x2_avx512f(auVar61,auVar65,0xdd);
              auVar62 = vshuff64x2_avx512f(auVar62,auVar66,0xdd);
              auVar64 = vshuff64x2_avx512f(auVar64,auVar68,0xdd);
              auVar59 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
              AT->data = (void *)auVar67._0_8_;
              AT->refcount = (int *)auVar67._8_8_;
              AT->elemsize = auVar67._16_8_;
              AT->elempack = auVar67._24_4_;
              *(int *)&AT->field_0x1c = auVar67._28_4_;
              AT->allocator = (Allocator *)auVar67._32_8_;
              AT->dims = auVar67._40_4_;
              AT->w = auVar67._44_4_;
              AT->h = auVar67._48_4_;
              AT->d = auVar67._52_4_;
              AT->c = auVar67._56_4_;
              *(int *)&AT->field_0x3c = auVar67._60_4_;
              *(undefined1 (*) [64])&AT->cstep = auVar69;
              *(undefined1 (*) [64])&AT[1].c = auVar70;
              *(undefined1 (*) [64])&AT[2].h = auVar71;
              *(undefined1 (*) [64])&AT[3].dims = auVar72;
              *(undefined1 (*) [64])&AT[4].allocator = auVar74;
              *(undefined1 (*) [64])&AT[5].elempack = auVar58;
              *(undefined1 (*) [64])&AT[6].elemsize = auVar60;
              AT[7].refcount = (int *)auVar73._0_8_;
              AT[7].elemsize = auVar73._8_8_;
              AT[7].elempack = auVar73._16_4_;
              *(int *)&AT[7].field_0x1c = auVar73._20_4_;
              AT[7].allocator = (Allocator *)auVar73._24_8_;
              AT[7].dims = auVar73._32_4_;
              AT[7].w = auVar73._36_4_;
              AT[7].h = auVar73._40_4_;
              AT[7].d = auVar73._44_4_;
              AT[7].c = auVar73._48_4_;
              *(int *)&AT[7].field_0x3c = auVar73._52_4_;
              AT[7].cstep = auVar73._56_8_;
              AT[8].data = (void *)auVar75._0_8_;
              AT[8].refcount = (int *)auVar75._8_8_;
              AT[8].elemsize = auVar75._16_8_;
              AT[8].elempack = auVar75._24_4_;
              *(int *)&AT[8].field_0x1c = auVar75._28_4_;
              AT[8].allocator = (Allocator *)auVar75._32_8_;
              AT[8].dims = auVar75._40_4_;
              AT[8].w = auVar75._44_4_;
              AT[8].h = auVar75._48_4_;
              AT[8].d = auVar75._52_4_;
              AT[8].c = auVar75._56_4_;
              *(int *)&AT[8].field_0x3c = auVar75._60_4_;
              *(undefined1 (*) [64])&AT[8].cstep = auVar76;
              *(undefined1 (*) [64])&AT[9].c = auVar77;
              *(undefined1 (*) [64])&AT[10].h = auVar61;
              *(undefined1 (*) [64])&AT[0xb].dims = auVar62;
              *(undefined1 (*) [64])&AT[0xc].allocator = auVar64;
              *(undefined1 (*) [64])&AT[0xd].elempack = auVar59;
              AT = (Mat *)&AT[0xe].elemsize;
              iVar27 = iVar27 + 0x10;
              local_e8 = local_e8 + 0x40;
            } while (iVar27 < max_kk);
            lVar56 = local_e8 + lVar42 + (lVar55 + 0xf) * lVar44 * 4;
            lVar35 = local_e8 + lVar42 + (lVar55 + 0xe) * lVar44 * 4;
            lVar24 = local_e8 + lVar42 + (lVar55 + 0xd) * lVar44 * 4;
            lVar33 = local_e8 + lVar42 + lVar47 * 4;
            lVar48 = local_e8 + lVar42 + (lVar55 + 0xb) * lVar44 * 4;
            local_130 = local_e8 + lVar42 + (lVar55 + 10) * lVar44 * 4;
            local_138 = local_e8 + lVar42 + (lVar55 + 9) * lVar44 * 4;
            lVar38 = local_e8 + lVar42 + lVar40 * 4;
            local_100 = local_e8 + lVar42 + (lVar55 + 7) * lVar44 * 4;
            lVar45 = local_e8 + lVar42 + (lVar55 + 6) * lVar44 * 4;
            local_120 = local_e8 + lVar42 + (lVar55 + 5) * lVar44 * 4;
            lVar51 = local_e8 + lVar42 + lVar29 * 4;
            local_f0 = lVar42 + (lVar55 + 3) * lVar44 * 4 + local_e8;
            local_128 = lVar42 + (lVar55 + 2) * lVar44 * 4 + local_e8;
            local_f8 = lVar42 + (lVar55 + 1) * lVar44 * 4 + local_e8;
            local_e8 = local_e8 + lVar19;
            uVar53 = max_kk & 0xfffffff0;
          }
          if ((int)uVar53 < max_kk) {
            lVar41 = 0;
            do {
              *(undefined4 *)&AT->data = *(undefined4 *)(local_e8 + lVar41 * 4);
              *(undefined4 *)((long)&AT->data + 4) = *(undefined4 *)(local_f8 + lVar41 * 4);
              *(undefined4 *)&AT->refcount = *(undefined4 *)(local_128 + lVar41 * 4);
              *(undefined4 *)((long)&AT->refcount + 4) = *(undefined4 *)(local_f0 + lVar41 * 4);
              *(undefined4 *)&AT->elemsize = *(undefined4 *)(lVar51 + lVar41 * 4);
              *(undefined4 *)((long)&AT->elemsize + 4) = *(undefined4 *)(local_120 + lVar41 * 4);
              AT->elempack = *(int *)(lVar45 + lVar41 * 4);
              *(undefined4 *)&AT->field_0x1c = *(undefined4 *)(local_100 + lVar41 * 4);
              *(undefined4 *)&AT->allocator = *(undefined4 *)(lVar38 + lVar41 * 4);
              *(undefined4 *)((long)&AT->allocator + 4) = *(undefined4 *)(local_138 + lVar41 * 4);
              AT->dims = *(int *)(local_130 + lVar41 * 4);
              AT->w = *(int *)(lVar48 + lVar41 * 4);
              AT->h = *(int *)(lVar33 + lVar41 * 4);
              AT->d = *(int *)(lVar24 + lVar41 * 4);
              AT->c = *(int *)(lVar35 + lVar41 * 4);
              *(undefined4 *)&AT->field_0x3c = *(undefined4 *)(lVar56 + lVar41 * 4);
              AT = (Mat *)&AT->cstep;
              lVar41 = lVar41 + 1;
            } while (max_kk - uVar53 != (int)lVar41);
          }
        }
      }
LAB_0049ef5d:
      uVar30 = uVar26 + 0x10;
      uVar50 = uVar26 + 0x1f;
      lVar57 = lVar57 + lVar20;
      lVar28 = lVar28 + lVar20;
      lVar46 = lVar46 + lVar20;
      lVar49 = lVar49 + lVar20;
      lVar34 = lVar34 + lVar20;
      local_140 = local_140 + lVar20;
      local_168 = local_168 + lVar20;
      uVar26 = uVar30;
    } while (uVar50 < (uint)max_ii);
  }
  lVar57 = (long)max_ii;
  if ((int)((uint)uVar30 | 7) < max_ii) {
    uVar26 = uVar30 & 0xffffffff;
    lVar42 = (lVar55 + uVar26 + 4) * lVar44;
    lVar46 = (long)(k * 4) * 4;
    lVar28 = lVar46 + lVar42 * 4;
    lVar19 = lVar44 * 0x20;
    lVar34 = (lVar55 + uVar26) * lVar44;
    lVar46 = lVar46 + lVar34 * 4;
    local_140 = lVar43 * 4;
    lVar49 = local_140 + (lVar55 + uVar26 + 7) * lVar44 * 4;
    local_198 = local_140 + (lVar55 + uVar26 + 6) * lVar44 * 4;
    local_1c0 = local_140 + (lVar55 + uVar26 + 5) * lVar44 * 4;
    local_1b0 = local_140 + lVar42 * 4;
    local_1a0 = local_140 + (lVar55 + uVar26 + 3) * lVar44 * 4;
    local_1a8 = local_140 + (lVar55 + uVar26 + 2) * lVar44 * 4;
    local_158 = local_140 + (lVar55 + uVar26 + 1) * lVar44 * 4;
    local_140 = local_140 + lVar34 * 4;
    do {
      if (iVar37 == 8) {
        if (0 < max_kk) {
          pauVar21 = (undefined1 (*) [32])
                     ((long)A->data + (long)(k * 8) * 4 + (uVar26 + lVar55) * lVar44 * 4);
          iVar27 = max_kk;
          do {
            *(undefined1 (*) [32])AT = *pauVar21;
            AT = (Mat *)&AT->allocator;
            pauVar21 = pauVar21 + 1;
            iVar27 = iVar27 + -1;
          } while (iVar27 != 0);
          goto LAB_0049f0e4;
        }
      }
      else {
LAB_0049f0e4:
        if (iVar37 == 4) {
          if (max_kk < 1) goto LAB_0049f410;
          pvVar23 = A->data;
          iVar27 = max_kk;
          do {
            piVar15 = (int *)((undefined8 *)((long)pvVar23 + lVar46))[1];
            AT->data = *(void **)((long)pvVar23 + lVar46);
            AT->refcount = piVar15;
            *(undefined1 (*) [16])&AT->elemsize = *(undefined1 (*) [16])((long)pvVar23 + lVar28);
            AT = (Mat *)&AT->allocator;
            pvVar23 = (void *)((long)pvVar23 + 0x10);
            iVar27 = iVar27 + -1;
          } while (iVar27 != 0);
        }
        if (iVar37 == 1) {
          pvVar23 = A->data;
          if (max_kk < 8) {
            lVar34 = lVar43 * 4 + (uVar26 + lVar55) * lVar44 * 4;
            lVar56 = lVar43 * 4 + (uVar26 + lVar55 + 1) * lVar44 * 4;
            lVar47 = lVar43 * 4 + (uVar26 + lVar55 + 2) * lVar44 * 4;
            lVar40 = lVar43 * 4 + (uVar26 + lVar55 + 3) * lVar44 * 4;
            lVar29 = lVar43 * 4 + (lVar55 + uVar26 + 4) * lVar44 * 4;
            lVar20 = lVar43 * 4 + (uVar26 + lVar55 + 5) * lVar44 * 4;
            lVar52 = lVar43 * 4 + (uVar26 + lVar55 + 6) * lVar44 * 4;
            lVar42 = lVar43 * 4 + (lVar55 + uVar26 + 7) * lVar44 * 4;
            uVar53 = 0;
          }
          else {
            iVar27 = 7;
            lVar34 = 0;
            pMVar18 = AT;
            do {
              pMVar25 = pMVar18;
              ppvVar2 = &AT->data + lVar34;
              lVar42 = lVar34 + local_140;
              auVar3 = *(undefined1 (*) [32])((long)pvVar23 + lVar34 + local_140);
              lVar52 = lVar44 * 8 + lVar42;
              auVar82 = *(undefined1 (*) [32])((long)pvVar23 + lVar44 * 4 + lVar42);
              auVar83 = *(undefined1 (*) [32])((long)pvVar23 + lVar44 * 8 + lVar42);
              auVar4 = *(undefined1 (*) [32])((long)pvVar23 + lVar44 * 4 + lVar52);
              lVar42 = lVar44 * 8 + lVar52;
              auVar5 = *(undefined1 (*) [32])((long)pvVar23 + lVar44 * 8 + lVar52);
              lVar52 = lVar44 * 4 + lVar42;
              auVar84 = *(undefined1 (*) [32])((long)pvVar23 + lVar44 * 4 + lVar42);
              auVar6 = *(undefined1 (*) [32])((long)pvVar23 + lVar44 * 4 + lVar52);
              auVar7 = *(undefined1 (*) [32])((long)pvVar23 + lVar44 * 8 + lVar52);
              auVar13 = vunpcklps_avx(auVar3,auVar82);
              auVar82 = vunpckhps_avx(auVar3,auVar82);
              auVar3 = vunpcklps_avx(auVar83,auVar4);
              auVar83 = vunpckhps_avx(auVar83,auVar4);
              auVar85 = vunpcklps_avx(auVar5,auVar84);
              auVar4 = vunpckhps_avx(auVar5,auVar84);
              auVar86 = vunpcklps_avx(auVar6,auVar7);
              auVar5 = vunpckhps_avx(auVar6,auVar7);
              auVar84 = vunpcklpd_avx(auVar13,auVar3);
              auVar3 = vunpckhpd_avx(auVar13,auVar3);
              auVar6 = vunpcklpd_avx(auVar82,auVar83);
              auVar82 = vunpckhpd_avx(auVar82,auVar83);
              auVar7 = vunpcklpd_avx(auVar85,auVar86);
              auVar83 = vunpckhpd_avx(auVar85,auVar86);
              auVar13 = vunpcklpd_avx(auVar4,auVar5);
              auVar4 = vunpckhpd_avx(auVar4,auVar5);
              auVar85._16_16_ = auVar7._0_16_;
              auVar85._0_16_ = auVar84._0_16_;
              auVar86._16_16_ = auVar83._0_16_;
              auVar86._0_16_ = auVar3._0_16_;
              auVar87._16_16_ = auVar13._0_16_;
              auVar87._0_16_ = auVar6._0_16_;
              auVar88._16_16_ = auVar4._0_16_;
              auVar88._0_16_ = auVar82._0_16_;
              auVar5 = vperm2f128_avx(auVar84,auVar7,0x31);
              auVar3 = vperm2f128_avx(auVar3,auVar83,0x31);
              auVar83 = vperm2f128_avx(auVar6,auVar13,0x31);
              auVar82 = vperm2f128_avx(auVar82,auVar4,0x31);
              *(undefined1 (*) [32])ppvVar2 = auVar85;
              *(undefined1 (*) [32])(ppvVar2 + 4) = auVar86;
              *(undefined1 (*) [32])(ppvVar2 + 8) = auVar87;
              *(undefined1 (*) [32])(ppvVar2 + 0xc) = auVar88;
              *(undefined1 (*) [32])(ppvVar2 + 0x10) = auVar5;
              *(undefined1 (*) [32])(ppvVar2 + 0x14) = auVar3;
              *(undefined1 (*) [32])(ppvVar2 + 0x18) = auVar83;
              *(undefined1 (*) [32])(ppvVar2 + 0x1c) = auVar82;
              lVar34 = lVar34 + 0x20;
              iVar27 = iVar27 + 8;
              pMVar18 = (Mat *)(ppvVar2 + 0x20);
            } while (iVar27 < max_kk);
            AT = (Mat *)&pMVar25[3].dims;
            lVar42 = lVar34 + lVar49;
            lVar52 = lVar34 + local_198;
            lVar20 = lVar34 + local_1c0;
            lVar29 = lVar34 + local_1b0;
            lVar40 = lVar34 + local_1a0;
            lVar47 = lVar34 + local_1a8;
            lVar56 = lVar34 + local_158;
            lVar34 = lVar34 + local_140;
            uVar53 = max_kk & 0xfffffff8;
          }
          iVar27 = max_kk - uVar53;
          if (iVar27 != 0 && (int)uVar53 <= max_kk) {
            lVar24 = 0;
            lVar35 = 0;
            do {
              *(undefined4 *)(&AT->data + lVar35) = *(undefined4 *)((long)pvVar23 + lVar35 + lVar34)
              ;
              *(undefined4 *)((long)&AT->data + lVar35 * 8 + 4) =
                   *(undefined4 *)((long)pvVar23 + lVar35 + lVar56);
              *(undefined4 *)(&AT->refcount + lVar35) =
                   *(undefined4 *)((long)pvVar23 + lVar35 + lVar47);
              *(undefined4 *)((long)&AT->refcount + lVar35 * 8 + 4) =
                   *(undefined4 *)((long)pvVar23 + lVar35 + lVar40);
              *(undefined4 *)(&AT->elemsize + lVar35) =
                   *(undefined4 *)((long)pvVar23 + lVar35 + lVar29);
              *(undefined4 *)((long)&AT->elemsize + lVar35 * 8 + 4) =
                   *(undefined4 *)((long)pvVar23 + lVar35 + lVar20);
              (&AT->elempack)[lVar35 * 2] = *(int *)((long)pvVar23 + lVar35 + lVar52);
              *(undefined4 *)(&AT->field_0x1c + lVar35 * 8) =
                   *(undefined4 *)((long)pvVar23 + lVar35 + lVar42);
              lVar35 = lVar35 + 4;
              lVar24 = lVar24 + -0x20;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
            AT = (Mat *)((long)AT - lVar24);
          }
        }
      }
LAB_0049f410:
      uVar30 = uVar26 + 8;
      lVar34 = uVar26 + 0xf;
      lVar28 = lVar28 + lVar19;
      lVar46 = lVar46 + lVar19;
      lVar49 = lVar49 + lVar19;
      local_198 = local_198 + lVar19;
      local_1c0 = local_1c0 + lVar19;
      local_1b0 = local_1b0 + lVar19;
      local_1a0 = local_1a0 + lVar19;
      local_1a8 = local_1a8 + lVar19;
      local_158 = local_158 + lVar19;
      local_140 = local_140 + lVar19;
      uVar26 = uVar30;
    } while (lVar34 < lVar57);
  }
  if ((int)((uint)uVar30 | 3) < max_ii) {
    uVar26 = uVar30 & 0xffffffff;
    lVar34 = lVar43 * 4;
    lVar28 = lVar34 + (lVar55 + uVar26 + 3) * lVar44 * 4;
    lVar19 = lVar44 * 0x10;
    lVar46 = lVar34 + (lVar55 + uVar26 + 2) * lVar44 * 4;
    lVar49 = lVar34 + (lVar55 + uVar26 + 1) * lVar44 * 4;
    lVar34 = lVar34 + (lVar55 + uVar26) * lVar44 * 4;
    do {
      if (iVar37 == 4) {
        if (0 < max_kk) {
          pauVar31 = (undefined1 (*) [16])
                     ((long)A->data + (long)(k * 4) * 4 + (uVar26 + lVar55) * lVar44 * 4);
          iVar27 = max_kk;
          do {
            *(undefined1 (*) [16])AT = *pauVar31;
            AT = (Mat *)&AT->elemsize;
            pauVar31 = pauVar31 + 1;
            iVar27 = iVar27 + -1;
          } while (iVar27 != 0);
          goto LAB_0049f511;
        }
      }
      else {
LAB_0049f511:
        if (iVar37 == 1) {
          pvVar23 = A->data;
          if (max_kk < 8) {
            uVar53 = 0;
            lVar29 = lVar43 * 4 + (uVar26 + lVar55) * lVar44 * 4;
            lVar20 = lVar43 * 4 + (uVar26 + lVar55 + 1) * lVar44 * 4;
            lVar52 = lVar43 * 4 + (uVar26 + lVar55 + 2) * lVar44 * 4;
            lVar42 = lVar43 * 4 + (uVar26 + lVar55 + 3) * lVar44 * 4;
          }
          else {
            iVar27 = 7;
            lVar29 = 0;
            pMVar18 = AT;
            do {
              pMVar25 = pMVar18;
              pauVar21 = (undefined1 (*) [32])((long)&AT->data + lVar29 * 4);
              auVar3 = *(undefined1 (*) [32])((long)pvVar23 + lVar29 + lVar34);
              auVar82 = *(undefined1 (*) [32])((long)pvVar23 + lVar29 + lVar49);
              auVar83 = *(undefined1 (*) [32])((long)pvVar23 + lVar29 + lVar46);
              auVar4 = *(undefined1 (*) [32])((long)pvVar23 + lVar29 + lVar28);
              auVar5 = vunpcklps_avx(auVar3,auVar82);
              auVar82 = vunpckhps_avx(auVar3,auVar82);
              auVar3 = vunpcklps_avx(auVar83,auVar4);
              auVar83 = vunpckhps_avx(auVar83,auVar4);
              auVar4 = vunpcklpd_avx(auVar5,auVar3);
              auVar3 = vunpckhpd_avx(auVar5,auVar3);
              auVar5 = vunpcklpd_avx(auVar82,auVar83);
              auVar82 = vunpckhpd_avx(auVar82,auVar83);
              auVar83._16_16_ = auVar3._0_16_;
              auVar83._0_16_ = auVar4._0_16_;
              auVar84._16_16_ = auVar82._0_16_;
              auVar84._0_16_ = auVar5._0_16_;
              auVar3 = vperm2f128_avx(auVar4,auVar3,0x31);
              auVar82 = vperm2f128_avx(auVar5,auVar82,0x31);
              *pauVar21 = auVar83;
              pauVar21[1] = auVar84;
              pauVar21[2] = auVar3;
              pauVar21[3] = auVar82;
              lVar29 = lVar29 + 0x20;
              iVar27 = iVar27 + 8;
              pMVar18 = (Mat *)(pauVar21 + 4);
            } while (iVar27 < max_kk);
            AT = (Mat *)&pMVar25[1].c;
            lVar42 = lVar29 + lVar28;
            lVar52 = lVar29 + lVar46;
            lVar20 = lVar29 + lVar49;
            lVar29 = lVar29 + lVar34;
            uVar53 = max_kk & 0xfffffff8;
          }
          lVar52 = (long)pvVar23 + lVar52;
          lVar42 = (long)pvVar23 + lVar42;
          lVar20 = (long)pvVar23 + lVar20;
          lVar29 = (long)pvVar23 + lVar29;
          if ((int)(uVar53 | 3) < max_kk) {
            lVar40 = 0;
            pMVar18 = AT;
            uVar54 = uVar53;
            do {
              pMVar25 = pMVar18;
              auVar11 = vunpcklps_avx(*(undefined1 (*) [16])(lVar29 + lVar40),
                                      *(undefined1 (*) [16])(lVar20 + lVar40));
              auVar12 = vunpcklps_avx(*(undefined1 (*) [16])(lVar52 + lVar40),
                                      *(undefined1 (*) [16])(lVar42 + lVar40));
              auVar8 = vunpckhps_avx(*(undefined1 (*) [16])(lVar29 + lVar40),
                                     *(undefined1 (*) [16])(lVar20 + lVar40));
              auVar9 = vunpckhps_avx(*(undefined1 (*) [16])(lVar52 + lVar40),
                                     *(undefined1 (*) [16])(lVar42 + lVar40));
              auVar10 = vunpcklpd_avx(auVar11,auVar12);
              auVar11 = vunpckhpd_avx(auVar11,auVar12);
              auVar12 = vunpcklpd_avx(auVar8,auVar9);
              auVar8 = vunpckhpd_avx(auVar8,auVar9);
              pMVar18 = (Mat *)((long)&AT->cstep + lVar40 * 4);
              pMVar18[-1].refcount = (int *)auVar10._0_8_;
              pMVar18[-1].elemsize = auVar10._8_8_;
              pMVar18[-1].elempack = auVar11._0_4_;
              *(int *)&pMVar18[-1].field_0x1c = auVar11._4_4_;
              pMVar18[-1].allocator = (Allocator *)auVar11._8_8_;
              pMVar18[-1].dims = auVar12._0_4_;
              pMVar18[-1].w = auVar12._4_4_;
              pMVar18[-1].h = auVar12._8_4_;
              pMVar18[-1].d = auVar12._12_4_;
              pMVar18[-1].c = auVar8._0_4_;
              *(int *)&pMVar18[-1].field_0x3c = auVar8._4_4_;
              pMVar18[-1].cstep = auVar8._8_8_;
              uVar53 = uVar54 + 4;
              lVar40 = lVar40 + 0x10;
              iVar27 = uVar54 + 7;
              uVar54 = uVar53;
            } while (iVar27 < max_kk);
            AT = (Mat *)&pMVar25->cstep;
            lVar42 = lVar42 + lVar40;
            lVar52 = lVar52 + lVar40;
            lVar20 = lVar20 + lVar40;
            lVar29 = lVar29 + lVar40;
          }
          if ((int)uVar53 < max_kk) {
            lVar40 = 0;
            do {
              *(undefined4 *)&AT->data = *(undefined4 *)(lVar29 + lVar40 * 4);
              *(undefined4 *)((long)&AT->data + 4) = *(undefined4 *)(lVar20 + lVar40 * 4);
              *(undefined4 *)&AT->refcount = *(undefined4 *)(lVar52 + lVar40 * 4);
              *(undefined4 *)((long)&AT->refcount + 4) = *(undefined4 *)(lVar42 + lVar40 * 4);
              AT = (Mat *)&AT->elemsize;
              lVar40 = lVar40 + 1;
            } while (max_kk - uVar53 != (int)lVar40);
          }
        }
      }
      uVar30 = uVar26 + 4;
      lVar42 = uVar26 + 7;
      lVar28 = lVar28 + lVar19;
      lVar46 = lVar46 + lVar19;
      lVar49 = lVar49 + lVar19;
      lVar34 = lVar34 + lVar19;
      uVar26 = uVar30;
    } while (lVar42 < lVar57);
  }
  if ((int)((uint)uVar30 | 1) < max_ii) {
    uVar26 = (ulong)(int)(uint)uVar30;
    lVar28 = lVar43 * 4 + (uVar26 + lVar55 + 1) * lVar44 * 4;
    lVar46 = lVar43 * 4 + (uVar26 + lVar55) * lVar44 * 4;
    do {
      pvVar23 = A->data;
      if (max_kk < 8) {
        lVar34 = lVar43 * 4 + (uVar26 + lVar55) * lVar44 * 4;
        lVar49 = lVar43 * 4 + (uVar26 + lVar55 + 1) * lVar44 * 4;
        uVar53 = 0;
      }
      else {
        iVar37 = 7;
        lVar34 = 0;
        pMVar18 = AT;
        do {
          pMVar25 = pMVar18;
          auVar3 = *(undefined1 (*) [32])((long)pvVar23 + lVar34 + lVar46);
          auVar82 = *(undefined1 (*) [32])((long)pvVar23 + lVar34 + lVar28);
          auVar83 = vunpcklps_avx(auVar3,auVar82);
          auVar3 = vunpckhps_avx(auVar3,auVar82);
          auVar82._16_16_ = auVar3._0_16_;
          auVar82._0_16_ = auVar83._0_16_;
          auVar3 = vperm2f128_avx(auVar83,auVar3,0x31);
          pauVar21 = (undefined1 (*) [32])((long)&AT->data + lVar34 * 2);
          *pauVar21 = auVar82;
          pauVar21[1] = auVar3;
          lVar34 = lVar34 + 0x20;
          iVar37 = iVar37 + 8;
          pMVar18 = (Mat *)(pauVar21 + 2);
        } while (iVar37 < max_kk);
        AT = (Mat *)&pMVar25->cstep;
        lVar49 = lVar34 + lVar28;
        lVar34 = lVar34 + lVar46;
        uVar53 = max_kk & 0xfffffff8;
      }
      pauVar36 = (undefined1 (*) [16])((long)pvVar23 + lVar34);
      pauVar31 = (undefined1 (*) [16])((long)pvVar23 + lVar49);
      uVar54 = uVar53 | 3;
      while ((int)uVar54 < max_kk) {
        auVar8 = vunpcklps_avx(*pauVar36,*pauVar31);
        auVar11 = vunpckhps_avx(*pauVar36,*pauVar31);
        AT->data = (void *)auVar8._0_8_;
        AT->refcount = (int *)auVar8._8_8_;
        AT->elemsize = auVar11._0_8_;
        AT->elempack = auVar11._8_4_;
        *(int *)&AT->field_0x1c = auVar11._12_4_;
        AT = (Mat *)&AT->allocator;
        pauVar36 = pauVar36 + 1;
        pauVar31 = pauVar31 + 1;
        uVar54 = uVar53 + 7;
        uVar53 = uVar53 + 4;
      }
      if ((int)uVar53 < max_kk) {
        lVar49 = 0;
        do {
          *(undefined4 *)&AT->data = *(undefined4 *)(*pauVar36 + lVar49 * 4);
          *(undefined4 *)((long)&AT->data + 4) = *(undefined4 *)(*pauVar31 + lVar49 * 4);
          AT = (Mat *)&AT->refcount;
          lVar49 = lVar49 + 1;
        } while (max_kk - uVar53 != (int)lVar49);
      }
      uVar30 = uVar26 + 2;
      lVar49 = uVar26 + 3;
      lVar28 = lVar28 + lVar44 * 8;
      lVar46 = lVar46 + lVar44 * 8;
      uVar26 = uVar30;
    } while (lVar49 < lVar57);
  }
  if ((int)uVar30 < max_ii) {
    lVar28 = (long)(int)uVar30;
    do {
      puVar32 = (undefined8 *)((long)A->data + lVar43 * 4 + (lVar28 + lVar55) * lVar44 * 4);
      if (max_kk < 8) {
        uVar53 = 0;
      }
      else {
        iVar37 = 7;
        do {
          piVar15 = (int *)puVar32[1];
          sVar16 = puVar32[2];
          pAVar17 = (Allocator *)puVar32[3];
          AT->data = (int *)*puVar32;
          AT->refcount = piVar15;
          AT->elemsize = sVar16;
          *(Allocator **)&AT->elempack = pAVar17;
          AT = (Mat *)&AT->allocator;
          puVar32 = puVar32 + 4;
          iVar37 = iVar37 + 8;
          uVar53 = max_kk & 0xfffffff8;
        } while (iVar37 < max_kk);
      }
      uVar54 = uVar53 | 3;
      while ((int)uVar54 < max_kk) {
        piVar15 = (int *)puVar32[1];
        AT->data = (int *)*puVar32;
        AT->refcount = piVar15;
        AT = (Mat *)&AT->elemsize;
        puVar32 = puVar32 + 2;
        uVar54 = uVar53 + 7;
        uVar53 = uVar53 + 4;
      }
      if ((int)uVar53 < max_kk) {
        lVar46 = 0;
        lVar49 = 0;
        do {
          *(undefined4 *)((long)&AT->data + lVar49 * 4) =
               *(undefined4 *)((long)puVar32 + lVar49 * 4);
          lVar49 = lVar49 + 1;
          lVar46 = lVar46 + -4;
        } while (max_kk - uVar53 != (int)lVar49);
        AT = (Mat *)((long)AT - lVar46);
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 != lVar57);
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 16;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;
            const float* p1 = (const float*)A + (i + ii + 8) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                _mm256_store_ps(pp + 8, _mm256_load_ps(p1));
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;
            const float* p2 = (const float*)A + (i + ii + 8) * A_hstep + k * 4;
            const float* p3 = (const float*)A + (i + ii + 12) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                _mm_store_ps(pp + 12, _mm_load_ps(p3));
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
            const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
            const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
            const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
            const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
            const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
            const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
            const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
            const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(p0);
                __m512 _r1 = _mm512_loadu_ps(p1);
                __m512 _r2 = _mm512_loadu_ps(p2);
                __m512 _r3 = _mm512_loadu_ps(p3);
                __m512 _r4 = _mm512_loadu_ps(p4);
                __m512 _r5 = _mm512_loadu_ps(p5);
                __m512 _r6 = _mm512_loadu_ps(p6);
                __m512 _r7 = _mm512_loadu_ps(p7);
                __m512 _r8 = _mm512_loadu_ps(p8);
                __m512 _r9 = _mm512_loadu_ps(p9);
                __m512 _ra = _mm512_loadu_ps(pa);
                __m512 _rb = _mm512_loadu_ps(pb);
                __m512 _rc = _mm512_loadu_ps(pc);
                __m512 _rd = _mm512_loadu_ps(pd);
                __m512 _re = _mm512_loadu_ps(pe);
                __m512 _rf = _mm512_loadu_ps(pf);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += 16;
                p1 += 16;
                p2 += 16;
                p3 += 16;
                p4 += 16;
                p5 += 16;
                p6 += 16;
                p7 += 16;
                p8 += 16;
                p9 += 16;
                pa += 16;
                pb += 16;
                pc += 16;
                pd += 16;
                pe += 16;
                pf += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp[12] = pc[0];
                pp[13] = pd[0];
                pp[14] = pe[0];
                pp[15] = pf[0];
                pp += 16;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
                pc++;
                pd++;
                pe++;
                pf++;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 16, _r2);
                _mm256_store_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}